

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int error_set_description(ERROR_HANDLE error,char *description_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  ERROR_INSTANCE *error_instance;
  
  if (error == (ERROR_HANDLE)0x0) {
    iVar2 = 500;
  }
  else {
    item_value = amqpvalue_create_string(description_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x1fc;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(error->composite_value,1,item_value);
      iVar2 = 0x202;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int error_set_description(ERROR_HANDLE error, const char* description_value)
{
    int result;

    if (error == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ERROR_INSTANCE* error_instance = (ERROR_INSTANCE*)error;
        AMQP_VALUE description_amqp_value = amqpvalue_create_string(description_value);
        if (description_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(error_instance->composite_value, 1, description_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(description_amqp_value);
        }
    }

    return result;
}